

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O1

timestamp_ns_t __thiscall duckdb::StrpTimeFormat::ParseResult::ToTimestampNS(ParseResult *this)

{
  int iVar1;
  bool bVar2;
  date_t dVar3;
  int64_t right;
  ConversionException *pCVar4;
  timestamp_ns_t result;
  timestamp_t local_48;
  string local_40;
  
  if (this->is_special == true) {
    iVar1 = (this->special).days;
    if ((long)iVar1 == -0x7fffffff) {
      local_48.value = -0x7fffffffffffffff;
    }
    else if (iVar1 == 0x7fffffff) {
      local_48.value = 0x7fffffffffffffff;
    }
    else {
      local_48.value = (long)iVar1 * 86400000000000;
    }
  }
  else {
    dVar3 = Date::FromDate(this->data[0],this->data[1],this->data[2]);
    right = ToTimeNS(this);
    bVar2 = TryMultiplyOperator::Operation<long,long,long>
                      ((long)dVar3.days,86400000000000,&local_48.value);
    if (!bVar2) {
      pCVar4 = (ConversionException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Date out of nanosecond range: %d-%d-%d","");
      ConversionException::ConversionException<int,int,int>
                (pCVar4,&local_40,this->data[0],this->data[1],this->data[2]);
      __cxa_throw(pCVar4,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
    }
    bVar2 = TryAddOperator::Operation<long,long,long>(local_48.value,right,&local_48.value);
    if (!bVar2) {
      pCVar4 = (ConversionException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Overflow exception in date/time -> timestamp_ns conversion",""
                );
      ConversionException::ConversionException(pCVar4,&local_40);
      __cxa_throw(pCVar4,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  return (timestamp_ns_t)(timestamp_t)local_48.value;
}

Assistant:

timestamp_ns_t StrpTimeFormat::ParseResult::ToTimestampNS() {
	timestamp_ns_t result;
	if (is_special) {
		if (special == date_t::infinity()) {
			result.value = timestamp_t::infinity().value;
		} else if (special == date_t::ninfinity()) {
			result.value = timestamp_t::ninfinity().value;
		} else {
			result.value = special.days * Interval::NANOS_PER_DAY;
		}
	} else {
		// Don't use rounded µs
		const auto date = ToDate();
		const auto time = ToTimeNS();
		if (!TryMultiplyOperator::Operation<int64_t, int64_t, int64_t>(date.days, Interval::NANOS_PER_DAY,
		                                                               result.value)) {
			throw ConversionException("Date out of nanosecond range: %d-%d-%d", data[0], data[1], data[2]);
		}
		if (!TryAddOperator::Operation<int64_t, int64_t, int64_t>(result.value, time, result.value)) {
			throw ConversionException("Overflow exception in date/time -> timestamp_ns conversion");
		}
	}

	return result;
}